

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O0

rhash rhash_import(void *in,size_t size)

{
  rhash prVar1;
  size_t size_local;
  void *in_local;
  
  prVar1 = import_error_einval();
  return prVar1;
}

Assistant:

RHASH_API rhash rhash_import(const void* in, size_t size)
{
#if !defined(NO_IMPORT_EXPORT)
	const export_header* header = (const export_header*)in;
	size_t i;
	size_t imported_size;
	const unsigned* hash_ids;
	const char* src_item;
	rhash_context_ext* ectx;
	if (!header || IS_BAD_STATE(header->state) || size < sizeof(export_header))
		return import_error_einval();
	imported_size = sizeof(export_header) + sizeof(unsigned) * header->hash_vector_size;
	if (!header->hash_vector_size || size < imported_size)
		return import_error_einval();
	hash_ids = (const unsigned*)(const void*)(header + 1);
	ectx = (rhash_context_ext*)rhash_alloc_multi(header->hash_vector_size, hash_ids, 0);
	if (!ectx)
		return NULL; /* errno must be set by the previous function */
	ectx->state = header->state;
	ectx->hash_vector_size = header->hash_vector_size;
	ectx->flags = header->flags;
	ectx->rc.msg_size = header->msg_size;
	for (i = 0; i < ectx->hash_vector_size; i++) {
		void* dst_context = ectx->vector[i].context;
		struct rhash_hash_info* hash_info = ectx->vector[i].hash_info;
		unsigned is_special = (hash_info->info->flags & F_SPCEXP);
		size_t item_size;

		if (is_special) {
			size_t left_size;
			imported_size = GET_EXPORT_ALIGNED(imported_size);
			src_item = (const char*)in + imported_size;
			left_size = size - imported_size;
			assert(size >= imported_size);
			item_size = rhash_import_alg(hash_ids[i], dst_context, src_item, left_size);
			imported_size += item_size;
			if (!item_size || size < imported_size) {
				ectx->hash_vector_size = i + 1; /* clean only initialized contextes */
				rhash_free(&ectx->rc);
				return import_error_einval();
			}
		} else {
			src_item = (const char*)in + imported_size;
			item_size = hash_info->context_size;
			imported_size += item_size;
			if (size < imported_size) {
				ectx->hash_vector_size = i + 1;
				rhash_free(&ectx->rc);
				return import_error_einval();
			}
			memcpy(dst_context, src_item, item_size);
		}
	}
	return &ectx->rc;
#else
	return import_error_einval();
#endif /* !defined(NO_IMPORT_EXPORT) */
}